

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_suite.cpp
# Opt level: O0

void api_dynamic_suite::dynamic_subspan(void)

{
  reference piVar1;
  undefined4 local_74 [2];
  undefined4 local_6c;
  size_type local_68 [2];
  undefined1 local_58 [8];
  span<int,_18446744073709551615UL> subspan;
  undefined4 local_3c;
  size_type local_38 [2];
  undefined1 local_28 [8];
  span<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.tail = (pointer)0x160000000b;
  vista::span<int,_18446744073709551615UL>::span<4UL,_0>
            ((span<int,_18446744073709551615UL> *)local_28,(element_type (*) [4])&span.member.tail);
  local_38[0] = vista::span<int,_18446744073709551615UL>::size
                          ((span<int,_18446744073709551615UL> *)local_28);
  local_3c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xba,"void api_dynamic_suite::dynamic_subspan()",local_38,&local_3c);
  piVar1 = vista::span<int,_18446744073709551615UL>::front
                     ((span<int,_18446744073709551615UL> *)local_28);
  subspan.member.tail._4_4_ = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xbb,"void api_dynamic_suite::dynamic_subspan()",piVar1,
             (undefined1 *)((long)&subspan.member.tail + 4));
  _local_58 = (member_storage<int,_18446744073709551615UL>)
              vista::span<int,18446744073709551615ul>::subspan<2ul,18446744073709551615ul>
                        ((span<int,18446744073709551615ul> *)local_28);
  local_68[0] = vista::span<int,_18446744073709551615UL>::size
                          ((span<int,_18446744073709551615UL> *)local_58);
  local_6c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("subspan.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xbd,"void api_dynamic_suite::dynamic_subspan()",local_68,&local_6c);
  piVar1 = vista::span<int,_18446744073709551615UL>::front
                     ((span<int,_18446744073709551615UL> *)local_58);
  local_74[0] = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("subspan.front()","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xbe,"void api_dynamic_suite::dynamic_subspan()",piVar1,local_74);
  return;
}

Assistant:

void dynamic_subspan()
{
    int array[4] = { 11, 22, 33, 44 };
    vista::span<int> span(array);
    BOOST_TEST_EQ(span.size(), 4);
    BOOST_TEST_EQ(span.front(), 11);
    auto subspan = span.subspan<2>();
    BOOST_TEST_EQ(subspan.size(), 2);
    BOOST_TEST_EQ(subspan.front(), 33);
}